

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall QTreeViewPrivate::itemHeight(QTreeViewPrivate *this,int item)

{
  bool bVar1;
  uint uVar2;
  pointer pQVar3;
  int iVar4;
  QTreeViewItem *this_00;
  ulong uVar5;
  
  if (this->uniformRowHeights == true) {
    iVar4 = this->defaultItemHeight;
  }
  else {
    iVar4 = 0;
    if ((this->viewItems).d.size != 0) {
      this_00 = (this->viewItems).d.ptr + item;
      bVar1 = QModelIndex::isValid(&this_00->index);
      if (bVar1) {
        uVar5 = (ulong)*(short *)&(this->viewItems).d.ptr[item].field_0x22;
        if ((long)uVar5 < 1) {
          uVar2 = QTreeView::indexRowSizeHint
                            (*(QTreeView **)
                              &(this->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8,&this_00->index);
          uVar5 = (ulong)uVar2;
          pQVar3 = QList<QTreeViewItem>::data(&this->viewItems);
          *(short *)&pQVar3[item].field_0x22 = (short)uVar2;
        }
        iVar4 = 0;
        if (0 < (int)uVar5) {
          iVar4 = (int)uVar5;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int QTreeViewPrivate::itemHeight(int item) const
{
    Q_ASSERT(item < viewItems.size());
    if (uniformRowHeights)
        return defaultItemHeight;
    if (viewItems.isEmpty())
        return 0;
    const QModelIndex &index = viewItems.at(item).index;
    if (!index.isValid())
        return 0;
    int height = viewItems.at(item).height;
    if (height <= 0) {
        height = q_func()->indexRowSizeHint(index);
        viewItems[item].height = height;
    }
    return qMax(height, 0);
}